

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-spawn.c
# Opt level: O0

int run_test_spawn_tcp_server(void)

{
  int iVar1;
  undefined8 uVar2;
  uv_loop_t *loop;
  int local_5c;
  int r;
  int fd;
  sockaddr_in addr;
  uv_stdio_container_t stdio [4];
  
  init_process_options("spawn_tcp_server_helper",exit_cb);
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,&r);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-spawn.c"
            ,0x2b7,"0 == uv_ip4_addr(\"127.0.0.1\", TEST_PORT, &addr)");
    abort();
  }
  local_5c = -1;
  uVar2 = uv_default_loop();
  iVar1 = uv_tcp_init_ex(uVar2,&tcp_server,2);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-spawn.c"
            ,699,"r == 0");
    abort();
  }
  iVar1 = uv_tcp_bind(&tcp_server,&r,0);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-spawn.c"
            ,0x2bd,"r == 0");
    abort();
  }
  iVar1 = uv_fileno(&tcp_server,&local_5c);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-spawn.c"
            ,0x2c4,"r == 0");
    abort();
  }
  if (local_5c < 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-spawn.c"
            ,0x2c5,"fd > 0");
    abort();
  }
  options.stdio = (uv_stdio_container_t *)addr.sin_zero;
  addr.sin_zero[0] = '\x02';
  addr.sin_zero[1] = '\0';
  addr.sin_zero[2] = '\0';
  addr.sin_zero[3] = '\0';
  options.stdio_count = 4;
  uVar2 = uv_default_loop();
  iVar1 = uv_spawn(uVar2,&process,&options);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-spawn.c"
            ,0x2d3,"r == 0");
    abort();
  }
  uVar2 = uv_default_loop();
  iVar1 = uv_run(uVar2,0);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-spawn.c"
            ,0x2d6,"r == 0");
    abort();
  }
  if (exit_cb_called != 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-spawn.c"
            ,0x2d8,"exit_cb_called == 1");
    abort();
  }
  if (close_cb_called != 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-spawn.c"
            ,0x2d9,"close_cb_called == 1");
    abort();
  }
  loop = (uv_loop_t *)uv_default_loop();
  close_loop(loop);
  uVar2 = uv_default_loop();
  iVar1 = uv_loop_close(uVar2);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-spawn.c"
            ,0x2db,"0 == uv_loop_close(uv_default_loop())");
    abort();
  }
  uv_library_shutdown();
  return 0;
}

Assistant:

TEST_IMPL(spawn_tcp_server) {
  uv_stdio_container_t stdio[4];
  struct sockaddr_in addr;
  int fd;
  int r;
#ifdef _WIN32
  uv_os_fd_t handle;
#endif

  init_process_options("spawn_tcp_server_helper", exit_cb);

  ASSERT(0 == uv_ip4_addr("127.0.0.1", TEST_PORT, &addr));

  fd = -1;
  r = uv_tcp_init_ex(uv_default_loop(), &tcp_server, AF_INET);
  ASSERT(r == 0);
  r = uv_tcp_bind(&tcp_server, (const struct sockaddr*) &addr, 0);
  ASSERT(r == 0);
#ifdef _WIN32
  r = uv_fileno((uv_handle_t*) &tcp_server, &handle);
  fd = _open_osfhandle((intptr_t) handle, 0);
#else
  r = uv_fileno((uv_handle_t*) &tcp_server, &fd);
 #endif
  ASSERT(r == 0);
  ASSERT(fd > 0);

  options.stdio = stdio;
  options.stdio[0].flags = UV_INHERIT_FD;
  options.stdio[0].data.fd = 0;
  options.stdio[1].flags = UV_INHERIT_FD;
  options.stdio[1].data.fd = 1;
  options.stdio[2].flags = UV_INHERIT_FD;
  options.stdio[2].data.fd = 2;
  options.stdio[3].flags = UV_INHERIT_FD;
  options.stdio[3].data.fd = fd;
  options.stdio_count = 4;

  r = uv_spawn(uv_default_loop(), &process, &options);
  ASSERT(r == 0);

  r = uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  ASSERT(r == 0);

  ASSERT(exit_cb_called == 1);
  ASSERT(close_cb_called == 1);

  MAKE_VALGRIND_HAPPY();
  return 0;
}